

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::~IfcRailingType(IfcRailingType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x938bb0;
  *(undefined8 *)&this->field_0x30 = 0x938cc8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x938bd8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x938c00;
  *(undefined8 *)&this[-1].field_0x138 = 0x938c28;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x938c50;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x938c78;
  *(undefined8 *)this = 0x938ca0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x938f90;
  *(undefined8 *)&this->field_0x30 = 0x939058;
  *(undefined8 *)&this[-1].field_0xd0 = 0x938fb8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x938fe0;
  *(undefined8 *)&this[-1].field_0x138 = 0x939008;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x939030;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00938cf0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}